

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.h
# Opt level: O2

void __thiscall MeCab::FeatureIndex::~FeatureIndex(FeatureIndex *this)

{
  this->_vptr_FeatureIndex = (_func_int **)&PTR___cxa_pure_virtual_0019f0f0;
  StringBuffer::~StringBuffer(&this->os_);
  DictionaryRewriter::~DictionaryRewriter(&this->rewrite_);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&(this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
            );
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&(this->unigram_templs_).
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  ChunkFreeList<char>::~ChunkFreeList(&this->char_freelist_);
  ChunkFreeList<int>::~ChunkFreeList(&this->feature_freelist_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->feature_).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

virtual ~FeatureIndex() {}